

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O3

IF97REGIONS IF97::RegionDetermination_pX(double p,double X,IF97parameters inkey)

{
  int iVar1;
  out_of_range *this;
  double dVar2;
  double dVar3;
  
  if ((RegionDetermination_pX(double,double,IF97parameters)::R1 == '\0') &&
     (iVar1 = __cxa_guard_acquire(&RegionDetermination_pX(double,double,IF97parameters)::R1),
     iVar1 != 0)) {
    Region1::Region1(&RegionDetermination_pX::R1);
    __cxa_atexit(BaseRegion::~BaseRegion,&RegionDetermination_pX::R1,&__dso_handle);
    __cxa_guard_release(&RegionDetermination_pX(double,double,IF97parameters)::R1);
  }
  if ((RegionDetermination_pX(double,double,IF97parameters)::R2 == '\0') &&
     (iVar1 = __cxa_guard_acquire(&RegionDetermination_pX(double,double,IF97parameters)::R2),
     iVar1 != 0)) {
    Region2::Region2(&RegionDetermination_pX::R2);
    __cxa_atexit(BaseRegion::~BaseRegion,&RegionDetermination_pX::R2,&__dso_handle);
    __cxa_guard_release(&RegionDetermination_pX(double,double,IF97parameters)::R2);
  }
  if ((p < 0.000611213) || (100.0 < p)) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Pressure out of range");
  }
  else {
    dVar2 = BaseRegion::output(&RegionDetermination_pX::R1.super_BaseRegion,inkey,273.15,p);
    dVar3 = BaseRegion::output(&RegionDetermination_pX::R2.super_BaseRegion,inkey,1073.15,p);
    if ((dVar2 <= X) && (X <= dVar3 + 1e-10)) {
      dVar3 = 0.0;
      dVar2 = 0.0;
      if (p <= 22.064) {
        if ((Tsat97(double)::R4 == '\0') &&
           (iVar1 = __cxa_guard_acquire(&Tsat97(double)::R4), iVar1 != 0)) {
          Region4::Region4(&Tsat97::R4);
          __cxa_atexit(Region4::~Region4,&Tsat97::R4,&__dso_handle);
          __cxa_guard_release(&Tsat97(double)::R4);
        }
        dVar2 = Region4::T_p(&Tsat97::R4,p);
        dVar3 = RegionOutput(inkey,dVar2,p,LIQUID);
        dVar2 = RegionOutput(inkey,dVar2,p,VAPOR);
        if ((dVar3 <= X) && (X <= dVar2)) {
          return REGION_4;
        }
      }
      if (p <= 16.529164252605) {
        if (dVar3 <= X) {
          return (uint)(X <= dVar2) * 2 + REGION_2;
        }
      }
      else {
        dVar2 = BaseRegion::output(&RegionDetermination_pX::R1.super_BaseRegion,inkey,623.15,p);
        if (dVar2 < X) {
          dVar3 = (p - *(double *)(region23_n + 0x20)) / *(double *)(region23_n + 0x10);
          dVar2 = *(double *)(region23_n + 0x18);
          if (dVar3 < 0.0) {
            dVar3 = sqrt(dVar3);
          }
          else {
            dVar3 = SQRT(dVar3);
          }
          dVar2 = BaseRegion::output(&RegionDetermination_pX::R2.super_BaseRegion,inkey,
                                     dVar2 + dVar3,p);
          return (X < dVar2) + REGION_2;
        }
      }
      return REGION_1;
    }
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    if (inkey == IF97_HMASS) {
      std::out_of_range::out_of_range(this,"Enthalpy out of range");
    }
    else {
      std::out_of_range::out_of_range(this,"Entropy out of range");
    }
  }
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline IF97REGIONS RegionDetermination_pX(double p, double X, IF97parameters inkey){
        // Setup needed Region Equations for region determination
        static Region1 R1;
        static Region2 R2;
        // Saturation Region Limit Variables (initialized outside of the if statements below)
        double Tsat = 0;
        double Xliq = 0;
        double Xvap = 0;

        // Check overall boundary limits - Throw errors if not met
        if ((p < Pmin) || (p > Pmax))
                throw std::out_of_range("Pressure out of range");
        double Xmin = R1.output(inkey,Tmin,p);
        double Xmax = R2.output(inkey,Tmax,p);
        if (( X < Xmin ) || (X > (Xmax + 1.0E-10) )){
            if (inkey == IF97_HMASS){
                throw std::out_of_range("Enthalpy out of range");
            }
            else{
                throw std::out_of_range("Entropy out of range");
            }
        }

        if (p <= Pcrit) {  // Check saturation Dome first

            Tsat = Tsat97(p);
            Xliq = RegionOutput(inkey, Tsat, p, LIQUID);  // Makes determination between Regions 1 & 3.
            Xvap = RegionOutput(inkey, Tsat, p, VAPOR);   // Makes determination between Regions 2 & 3.

            if ((Xliq <= X) && (X <= Xvap)) {  // Within Saturation Dome (inclusive)
                return REGION_4;               //    Region 4
            }
        }
        // End Check of saturation Dome

        // Check values below min pressure on B23 line (16.529 MPa)
        if (p <= P23min) {  // p <= P23min (saturation dome)
            if (X < Xliq) {
                return REGION_1;
            } else if (X > Xvap) {
                return REGION_2;
            } else {
                return REGION_4;  // This should already be handled and returned above.
            }
        }
        // Check values above P23min
        else if (X <= R1.output(inkey, T23min, p))         // T23min is also the Temp between R1 & R3a
            return REGION_1;                               // ...otherwise R3a (fallthrough)
        else if (X >= R2.output(inkey, Region23_p(p), p))  // compare with X along B23 curve
            return REGION_2;                               // ...othersise R3b (fallthrough)
        else
            return REGION_3;                               // Return R3 since R4 has already been accounted for above.

    }